

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if2.c
# Opt level: O2

int pigpioOpenSocket(char *addr,char *port)

{
  addrinfo *paVar1;
  int iVar2;
  int __fd;
  addrinfo **__pai;
  int opt;
  addrinfo *res;
  addrinfo local_68;
  
  if (addr == (char *)0x0) {
    addr = getenv("PIGPIO_ADDR");
    if ((addr == (char *)0x0) || (*addr == '\0')) {
      addr = "127.0.0.1";
    }
  }
  if (port == (char *)0x0) {
    port = getenv("PIGPIO_PORT");
    if ((port == (char *)0x0) || (*port == '\0')) {
      port = "8888";
    }
  }
  local_68.ai_canonname = (char *)0x0;
  local_68.ai_next = (addrinfo *)0x0;
  local_68.ai_addrlen = 0;
  local_68._20_4_ = 0;
  local_68.ai_addr = (sockaddr *)0x0;
  local_68.ai_socktype = 1;
  local_68.ai_protocol = 0;
  local_68.ai_flags = 2;
  local_68.ai_family = 0;
  __pai = (addrinfo **)&res;
  iVar2 = getaddrinfo(addr,port,&local_68,__pai);
  __fd = -0x7d2;
  if (iVar2 == 0) {
    while (paVar1 = *__pai, paVar1 != (addrinfo *)0x0) {
      __fd = socket(paVar1->ai_family,paVar1->ai_socktype,paVar1->ai_protocol);
      if (__fd != -1) {
        opt = 1;
        setsockopt(__fd,6,1,&opt,4);
        iVar2 = connect(__fd,paVar1->ai_addr,paVar1->ai_addrlen);
        if (iVar2 != -1) goto LAB_001057f1;
      }
      __pai = &paVar1->ai_next;
    }
    __fd = -0x7d3;
LAB_001057f1:
    freeaddrinfo((addrinfo *)res);
  }
  return __fd;
}

Assistant:

static int pigpioOpenSocket(char *addr, char *port)
{
   int sock, err, opt;
   struct addrinfo hints, *res, *rp;
   const char *addrStr, *portStr;

   if (!addr)
   {
      addrStr = getenv(PI_ENVADDR);

      if ((!addrStr) || (!strlen(addrStr)))
      {
         addrStr = PI_DEFAULT_SOCKET_ADDR_STR;
      }
   }
   else addrStr = addr;

   if (!port)
   {
      portStr = getenv(PI_ENVPORT);

      if ((!portStr) || (!strlen(portStr)))
      {
         portStr = PI_DEFAULT_SOCKET_PORT_STR;
      }
   }
   else portStr = port;

   memset (&hints, 0, sizeof (hints));

   hints.ai_family   = PF_UNSPEC;
   hints.ai_socktype = SOCK_STREAM;
   hints.ai_flags   |= AI_CANONNAME;

   err = getaddrinfo (addrStr, portStr, &hints, &res);

   if (err) return pigif_bad_getaddrinfo;

   for (rp=res; rp!=NULL; rp=rp->ai_next)
   {
      sock = socket(rp->ai_family, rp->ai_socktype, rp->ai_protocol);

      if (sock == -1) continue;

      /* Disable the Nagle algorithm. */
      opt = 1;
      setsockopt(sock, IPPROTO_TCP, TCP_NODELAY, (char*)&opt, sizeof(int));

      if (connect(sock, rp->ai_addr, rp->ai_addrlen) != -1) break;
   }

   freeaddrinfo(res);

   if (rp == NULL) return pigif_bad_connect;

   return sock;
}